

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printAssignName(JSPrinter *this,Ref node)

{
  Value *this_00;
  AssignName *this_01;
  basic_string_view<char,_std::char_traits<char>_> *this_02;
  const_pointer s;
  Ref *pRVar1;
  AssignName *assign;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  this_00 = Ref::operator->((Ref *)&this_local);
  this_01 = cashew::Value::asAssignName(this_00);
  this_02 = &AssignName::target(this_01)->str;
  s = std::basic_string_view<char,_std::char_traits<char>_>::data(this_02);
  emit(this,s);
  space(this);
  emit(this,'=');
  space(this);
  pRVar1 = AssignName::value(this_01);
  printChild(this,pRVar1->inst,(Ref)this_local,1);
  return;
}

Assistant:

void printAssignName(Ref node) {
    auto* assign = node->asAssignName();
    emit(assign->target().str.data());
    space();
    emit('=');
    space();
    printChild(assign->value(), node, 1);
  }